

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cpp
# Opt level: O2

P_Sequence * compile_top(Pattern *p)

{
  Pattern *p_00;
  P_Sequence *pPVar1;
  Pattern *local_18;
  
  p_00 = AST::dispatch<compile_template>(p);
  pPVar1 = sequencify(p_00);
  local_18 = (Pattern *)operator_new(4);
  *(undefined4 *)local_18 = 9;
  std::vector<Pattern*,std::allocator<Pattern*>>::emplace_back<Pattern*>
            ((vector<Pattern*,std::allocator<Pattern*>> *)&pPVar1->v,&local_18);
  return pPVar1;
}

Assistant:

static Pattern* compile(AST::Pattern* p) {
    return AST::dispatch<compile_template>(p);
}